

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O3

void Gia_ManCheckUnateVecTest(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  Vec_Wec_t *__ptr;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  timespec ts;
  long local_60;
  Vec_Int_t *local_58;
  timespec local_50;
  ulong local_40;
  size_t local_38;
  
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  uVar12 = 0;
  __ptr = Gia_ManCheckUnateVec(p,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  iVar4 = p->vCis->nSize;
  local_38 = (size_t)iVar4;
  pvVar6 = calloc(local_38 + 1,1);
  if (fVerbose != 0) {
    printf("Inputs  : ");
    if (0 < iVar4) {
      uVar8 = 0;
      do {
        printf("%d",(ulong)(uint)((int)uVar8 + (int)(uVar8 / 10) * -10));
        uVar8 = (ulong)((int)uVar8 + 1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    putchar(10);
  }
  local_58 = p->vCos;
  uVar8 = (ulong)(uint)local_58->nSize;
  if (local_58->nSize < 1) {
    iVar4 = 0;
  }
  else {
    uVar12 = __ptr->nSize;
    if (__ptr->nSize < 1) {
      uVar12 = 0;
    }
    local_40 = (ulong)uVar12;
    uVar9 = 0;
    iVar4 = 0;
    uVar12 = 0;
    do {
      if (uVar9 == local_40) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar3 = __ptr->pArray;
      memset(pvVar6,0x20,local_38);
      iVar10 = pVVar3[uVar9].nSize;
      if (0 < iVar10) {
        uVar8 = 0;
        do {
          uVar1 = pVVar3[uVar9].pArray[uVar8];
          uVar5 = (int)uVar8 + 1;
          if ((int)uVar5 < iVar10) {
            if (((int)uVar1 < 0) || (uVar2 = pVVar3[uVar9].pArray[uVar5], (int)uVar2 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar11 = (ulong)(uVar1 >> 1);
            if (uVar1 >> 1 != uVar2 >> 1) goto LAB_007e97a4;
            *(undefined1 *)((long)pvVar6 + uVar11) = 0x2e;
            iVar4 = iVar4 + 1;
            uVar5 = (int)uVar8 + 2;
          }
          else {
            if ((int)uVar1 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            uVar11 = (ulong)(uVar1 >> 1);
LAB_007e97a4:
            *(char *)((long)pvVar6 + uVar11) = ((uVar1 & 1) == 0) * '\x02' + 'n';
            uVar12 = uVar12 + 1;
          }
          iVar10 = pVVar3[uVar9].nSize;
          uVar8 = (ulong)uVar5;
        } while ((int)uVar5 < iVar10);
      }
      if (fVerbose != 0) {
        printf("Out%4d : %s\n",uVar9 & 0xffffffff,pvVar6);
        local_58 = p->vCos;
      }
      uVar9 = uVar9 + 1;
      uVar8 = (ulong)local_58->nSize;
    } while ((long)uVar9 < (long)uVar8);
  }
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
    uVar8 = (ulong)(uint)local_58->nSize;
  }
  iVar10 = 0x9a3c8a;
  printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",(ulong)(uint)p->vCis->nSize,
         uVar8,(ulong)(iVar4 + uVar12),(ulong)uVar12);
  Abc_Print(iVar10,"%s =","Total time");
  iVar10 = 3;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar7 + local_60) / 1000000.0);
  iVar4 = __ptr->nCap;
  pVVar3 = __ptr->pArray;
  if ((long)iVar4 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_007e9902;
  }
  else {
    lVar7 = 0;
    do {
      pvVar6 = *(void **)((long)&pVVar3->pArray + lVar7);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)((long)&pVVar3->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar7);
  }
  free(pVVar3);
LAB_007e9902:
  free(__ptr);
  return;
}

Assistant:

void Gia_ManCheckUnateVecTest( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vUnates = Gia_ManCheckUnateVec( p, NULL, NULL );
    int i, o, Var, nVars = Gia_ManCiNum(p);
    int nUnate = 0, nNonUnate = 0;
    char * pBuffer = ABC_CALLOC( char, nVars+1 );
    if ( fVerbose )
    {
        printf( "Inputs  : " );
        for ( i = 0; i < nVars; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    for ( o = 0; o < Gia_ManCoNum(p); o++ )
    {
        Vec_Int_t * vUnate = Vec_WecEntry( vUnates, o );
        memset( pBuffer, ' ', (size_t)nVars );
        Vec_IntForEachEntry( vUnate, Var, i )
            if ( i+1 < Vec_IntSize(vUnate) && Abc_Lit2Var(Var) == Abc_Lit2Var(Vec_IntEntry(vUnate, i+1)) ) // both lits are present
                pBuffer[Abc_Lit2Var(Var)] = '.', i++, nNonUnate++; // does not depend on this var
            else
                pBuffer[Abc_Lit2Var(Var)] = Abc_LitIsCompl(Var) ? 'n' : 'p', nUnate++;
        if ( fVerbose )
            printf( "Out%4d : %s\n", o, pBuffer );
    }
    ABC_FREE( pBuffer );
    // print stats
    printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
        Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
    ABC_PRT( "Total time", Abc_Clock() - clk );
    //Vec_WecPrint( vUnates, 0 );
    Vec_WecFree( vUnates );
}